

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

int mbedtls_blowfish_crypt_cfb64
              (mbedtls_blowfish_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  ulong local_50;
  size_t n;
  byte *pbStack_40;
  int c;
  uchar *input_local;
  uchar *iv_local;
  size_t *iv_off_local;
  size_t length_local;
  int mode_local;
  mbedtls_blowfish_context *ctx_local;
  
  local_50 = *iv_off;
  if (local_50 < 8) {
    pbStack_40 = input;
    iv_off_local = (size_t *)length;
    if (mode == 0) {
      while (iv_off_local != (size_t *)0x0) {
        if (local_50 == 0) {
          mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = *pbStack_40;
        *output = bVar1 ^ iv[local_50];
        iv[local_50] = bVar1;
        local_50 = local_50 + 1 & 7;
        output = output + 1;
        pbStack_40 = pbStack_40 + 1;
        iv_off_local = (size_t *)((long)iv_off_local + -1);
      }
    }
    else {
      while (iv_off_local != (size_t *)0x0) {
        if (local_50 == 0) {
          mbedtls_blowfish_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = iv[local_50];
        bVar2 = *pbStack_40;
        *output = bVar1 ^ bVar2;
        iv[local_50] = bVar1 ^ bVar2;
        local_50 = local_50 + 1 & 7;
        output = output + 1;
        pbStack_40 = pbStack_40 + 1;
        iv_off_local = (size_t *)((long)iv_off_local + -1);
      }
    }
    *iv_off = local_50;
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x16;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_blowfish_crypt_cfb64( mbedtls_blowfish_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n;

    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( mode == MBEDTLS_BLOWFISH_ENCRYPT ||
                           mode == MBEDTLS_BLOWFISH_DECRYPT );
    BLOWFISH_VALIDATE_RET( iv     != NULL );
    BLOWFISH_VALIDATE_RET( iv_off != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || input  != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || output != NULL );

    n = *iv_off;
    if( n >= 8 )
        return( MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }

    *iv_off = n;

    return( 0 );
}